

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O2

void __thiscall
Am_Enum_Support::Am_Enum_Support(Am_Enum_Support *this,char *string,Am_Value_Type in_type)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  char **ppcVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  
  (this->super_Am_Type_Support)._vptr_Am_Type_Support = (_func_int **)&PTR_Print_002eae28;
  this->type = in_type;
  sVar2 = strlen(string);
  uVar7 = (ulong)((int)sVar2 + 1);
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  __dest = (char *)operator_new__(uVar7);
  strcpy(__dest,string);
  this->number = 1;
  uVar3 = 0;
  uVar7 = sVar2 & 0xffffffff;
  if ((int)sVar2 < 1) {
    uVar7 = uVar3;
  }
  iVar5 = 1;
  for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
    if (string[uVar3] == ' ') {
      iVar5 = iVar5 + 1;
      this->number = iVar5;
    }
  }
  uVar3 = (long)iVar5 << 3;
  if (iVar5 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppcVar4 = (char **)operator_new__(uVar3);
  *ppcVar4 = __dest;
  iVar5 = 1;
  pcVar6 = __dest;
  while( true ) {
    pcVar1 = pcVar6;
    pcVar6 = pcVar1 + 1;
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    if (*pcVar1 == ' ') {
      *pcVar1 = '\0';
      ppcVar4[iVar5] = pcVar6;
      iVar5 = iVar5 + 1;
    }
  }
  this->value_string = __dest;
  this->item = ppcVar4;
  Am_Register_Support(in_type,&this->super_Am_Type_Support);
  return;
}

Assistant:

Am_Enum_Support::Am_Enum_Support(const char *string, Am_Value_Type in_type)
{
  type = in_type;
  int len = strlen(string);
  char *hold = new char[len + 1];
  strcpy(hold, string);
  int i;
  number = 1;
  for (i = 0; i < len; ++i) {
    if (string[i] == ' ')
      ++number;
  }
  char **array = new char *[number];
  array[0] = hold;
  int j = 1;
  for (i = 0; i < len; ++i) {
    if (hold[i] == ' ') {
      hold[i] = '\0';
      array[j] = &hold[i + 1];
      ++j;
    }
  }
  value_string = hold;
  item = array;
  Am_Register_Support(type, this);
}